

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall duckdb_re2::CharClassBuilder::Negate(CharClassBuilder *this)

{
  bool bVar1;
  pointer pRVar2;
  value_type *pvVar3;
  uint *in_RDI;
  pair<std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>,_bool> pVar4;
  size_t i;
  int nextlo;
  iterator it;
  vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_> v;
  CharClassBuilder *in_stack_ffffffffffffff28;
  vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_> *in_stack_ffffffffffffff30;
  _Rb_tree_const_iterator<duckdb_re2::RuneRange> in_stack_ffffffffffffff40;
  value_type *__x;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  size_type in_stack_ffffffffffffff58;
  vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_> *in_stack_ffffffffffffff60;
  value_type *local_70;
  RuneRange local_68;
  RuneRange local_60;
  _Self local_58;
  int local_4c;
  RuneRange local_48;
  _Self local_40;
  _Self local_38 [3];
  vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_> local_20;
  
  std::vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_>::vector
            ((vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_> *)0x8083ee);
  std::set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
  ::size((set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
          *)0x8083fc);
  std::vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_>::reserve
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_38[0]._M_node = (_Base_ptr)begin(in_stack_ffffffffffffff28);
  local_40._M_node = (_Base_ptr)end(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(local_38,&local_40);
  if (bVar1) {
    RuneRange::RuneRange(&local_48,0,0x10ffff);
    std::vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_>::push_back
              (in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
  }
  else {
    local_4c = 0;
    pRVar2 = std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator->
                       ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)0x8084d5);
    if (pRVar2->lo == 0) {
      pRVar2 = std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator->
                         ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)0x8084e7);
      local_4c = pRVar2->hi + 1;
      std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator++
                ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)in_stack_ffffffffffffff30);
    }
    while( true ) {
      local_58._M_node = (_Base_ptr)end(in_stack_ffffffffffffff28);
      bVar1 = std::operator!=(local_38,&local_58);
      if (!bVar1) break;
      in_stack_ffffffffffffff54 = local_4c;
      pRVar2 = std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator->
                         ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)0x808554);
      RuneRange::RuneRange(&local_60,in_stack_ffffffffffffff54,pRVar2->lo + -1);
      std::vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_>::push_back
                (in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
      pRVar2 = std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator->
                         ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)0x808589);
      local_4c = pRVar2->hi + 1;
      std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator++
                ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)in_stack_ffffffffffffff30);
    }
    if (local_4c < 0x110000) {
      RuneRange::RuneRange(&local_68,local_4c,0x10ffff);
      std::vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_>::push_back
                (in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
    }
  }
  std::set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
  ::clear((set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
           *)0x8085f3);
  local_70 = (value_type *)0x0;
  while (__x = local_70,
        pvVar3 = (value_type *)
                 std::vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_>::size
                           (&local_20), __x < pvVar3) {
    std::vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_>::operator[]
              (&local_20,(size_type)local_70);
    pVar4 = std::
            set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
            ::insert((set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
                      *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__x);
    in_stack_ffffffffffffff40 = pVar4.first._M_node;
    local_70 = (value_type *)((long)&local_70->lo + 1);
  }
  *in_RDI = (*in_RDI ^ 0xffffffff) & 0x3ffffff;
  in_RDI[1] = (in_RDI[1] ^ 0xffffffff) & 0x3ffffff;
  in_RDI[2] = 0x110000 - in_RDI[2];
  std::vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_>::~vector
            ((vector<duckdb_re2::RuneRange,_std::allocator<duckdb_re2::RuneRange>_> *)
             in_stack_ffffffffffffff40._M_node);
  return;
}

Assistant:

void CharClassBuilder::Negate() {
  // Build up negation and then copy in.
  // Could edit ranges in place, but C++ won't let me.
  std::vector<RuneRange> v;
  v.reserve(ranges_.size() + 1);

  // In negation, first range begins at 0, unless
  // the current class begins at 0.
  iterator it = begin();
  if (it == end()) {
    v.push_back(RuneRange(0, Runemax));
  } else {
    int nextlo = 0;
    if (it->lo == 0) {
      nextlo = it->hi + 1;
      ++it;
    }
    for (; it != end(); ++it) {
      v.push_back(RuneRange(nextlo, it->lo - 1));
      nextlo = it->hi + 1;
    }
    if (nextlo <= Runemax)
      v.push_back(RuneRange(nextlo, Runemax));
  }

  ranges_.clear();
  for (size_t i = 0; i < v.size(); i++)
    ranges_.insert(v[i]);

  upper_ = AlphaMask & ~upper_;
  lower_ = AlphaMask & ~lower_;
  nrunes_ = Runemax+1 - nrunes_;
}